

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereClauseInsert(WhereClause *pWC,Expr *p,u16 wtFlags)

{
  int iVar1;
  WhereInfo *pWVar2;
  sqlite3 *db;
  LogEst LVar3;
  short sVar4;
  WhereMemBlock *pWVar5;
  u64 uVar6;
  WhereTerm *__dest;
  WhereTerm *pWVar7;
  ExprList_item *pEVar8;
  
  if (pWC->nSlot <= pWC->nTerm) {
    pWVar2 = pWC->pWInfo;
    pWVar7 = pWC->a;
    db = pWVar2->pParse->db;
    uVar6 = (long)pWC->nSlot * 0x70;
    pWVar5 = (WhereMemBlock *)sqlite3DbMallocRawNN(db,uVar6 + 0x10);
    if (pWVar5 == (WhereMemBlock *)0x0) {
      __dest = (WhereTerm *)0x0;
    }
    else {
      pWVar5->pNext = pWVar2->pMemToFree;
      pWVar5->sz = uVar6;
      pWVar2->pMemToFree = pWVar5;
      __dest = (WhereTerm *)(pWVar5 + 1);
    }
    pWC->a = __dest;
    if (__dest == (WhereTerm *)0x0) {
      if (p != (Expr *)0x0 && (wtFlags & 1) != 0) {
        sqlite3ExprDeleteNN(db,p);
      }
      pWC->a = pWVar7;
    }
    else {
      memcpy(__dest,pWVar7,(long)pWC->nTerm * 0x38);
      pWC->nSlot = pWC->nSlot << 1;
    }
    if (__dest == (WhereTerm *)0x0) {
      return 0;
    }
  }
  iVar1 = pWC->nTerm;
  pWC->nTerm = iVar1 + 1;
  if ((wtFlags & 2) == 0) {
    pWC->nBase = iVar1 + 1;
  }
  pWVar7 = pWC->a + iVar1;
  if (p == (Expr *)0x0) {
    pWVar7->truthProb = 1;
  }
  else {
    sVar4 = 1;
    if ((p->flags & 0x80000) != 0) {
      LVar3 = sqlite3LogEst((long)p->iTable);
      sVar4 = LVar3 + -0x10e;
    }
    pWVar7->truthProb = sVar4;
    while ((p != (Expr *)0x0 && ((p->flags & 0x82000) != 0))) {
      if ((p->flags >> 0x13 & 1) == 0) {
        if (p->op != 'r') break;
        pEVar8 = (ExprList_item *)&p->pLeft;
      }
      else {
        pEVar8 = ((p->x).pList)->a;
      }
      p = pEVar8->pExpr;
    }
  }
  pWVar7->pExpr = p;
  pWVar7->wtFlags = wtFlags;
  pWVar7->pWC = pWC;
  pWVar7->eOperator = 0;
  pWVar7->nChild = '\0';
  pWVar7->eMatchOp = '\0';
  pWVar7->iParent = 0;
  *(undefined8 *)&pWVar7->leftCursor = 0;
  *(undefined8 *)((long)&pWVar7->u + 4) = 0;
  *(undefined8 *)((long)&pWVar7->prereqRight + 4) = 0;
  *(undefined4 *)((long)&pWVar7->prereqAll + 4) = 0;
  return iVar1;
}

Assistant:

static int whereClauseInsert(WhereClause *pWC, Expr *p, u16 wtFlags){
  WhereTerm *pTerm;
  int idx;
  testcase( wtFlags & TERM_VIRTUAL );
  if( pWC->nTerm>=pWC->nSlot ){
    WhereTerm *pOld = pWC->a;
    sqlite3 *db = pWC->pWInfo->pParse->db;
    pWC->a = sqlite3WhereMalloc(pWC->pWInfo, sizeof(pWC->a[0])*pWC->nSlot*2 );
    if( pWC->a==0 ){
      if( wtFlags & TERM_DYNAMIC ){
        sqlite3ExprDelete(db, p);
      }
      pWC->a = pOld;
      return 0;
    }
    memcpy(pWC->a, pOld, sizeof(pWC->a[0])*pWC->nTerm);
    pWC->nSlot = pWC->nSlot*2;
  }
  pTerm = &pWC->a[idx = pWC->nTerm++];
  if( (wtFlags & TERM_VIRTUAL)==0 ) pWC->nBase = pWC->nTerm;
  if( p && ExprHasProperty(p, EP_Unlikely) ){
    pTerm->truthProb = sqlite3LogEst(p->iTable) - 270;
  }else{
    pTerm->truthProb = 1;
  }
  pTerm->pExpr = sqlite3ExprSkipCollateAndLikely(p);
  pTerm->wtFlags = wtFlags;
  pTerm->pWC = pWC;
  pTerm->iParent = -1;
  memset(&pTerm->eOperator, 0,
         sizeof(WhereTerm) - offsetof(WhereTerm,eOperator));
  return idx;
}